

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle_default.cpp
# Opt level: O2

StyleSheet * __thiscall
QStyleSheetStyle::getDefaultStyleSheet(StyleSheet *__return_storage_ptr__,QStyleSheetStyle *this)

{
  QList<QCss::Pseudo> *this_00;
  QStyle *pQVar1;
  long lVar2;
  storage_type *psVar3;
  QList<QCss::Declaration> *pQVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QByteArrayView QVar8;
  QByteArrayView QVar9;
  QByteArrayView QVar10;
  QByteArrayView QVar11;
  QByteArrayView QVar12;
  QArrayDataPointer<char16_t> local_1e8;
  Declaration decl;
  QArrayDataPointer<QCss::BasicSelector> local_1c8;
  AttributeSelector local_1a8;
  Pseudo local_168;
  BasicSelector local_128;
  StyleRule local_b8;
  QVariant local_80;
  undefined1 *local_60;
  anon_union_24_3_e3d07ef4_for_data local_58;
  undefined8 local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  memset(__return_storage_ptr__,0,0xa0);
  local_b8.selectors.d.d = (Data *)0x0;
  local_b8.selectors.d.ptr = (Selector *)0x0;
  local_b8.selectors.d.size = 0;
  local_b8.declarations.d.d = (Data *)0x0;
  local_b8.declarations.d.ptr = (Declaration *)0x0;
  local_b8.declarations.d.size = 0;
  local_b8.order = 0;
  local_b8._52_4_ = 0xaaaaaaaa;
  local_128.elementName.d.d = (Data *)0x0;
  local_128.elementName.d.ptr = (char16_t *)0x0;
  local_128.elementName.d.size = 0;
  local_128.ids.d.d = (Data *)0x0;
  local_128.ids.d.ptr = (QString *)0x0;
  local_128.ids.d.size = 0;
  local_128.pseudos.d.d = (Data *)0x0;
  local_128.pseudos.d.ptr = (Pseudo *)0x0;
  local_128.relationToNext = NoRelation;
  local_128._100_4_ = 0xaaaaaaaa;
  local_128.pseudos.d.size = 0;
  local_128.attributeSelectors.d.d = (Data *)0x0;
  local_1c8.size = 0;
  local_128.attributeSelectors.d.ptr = (AttributeSelector *)0x0;
  local_128.attributeSelectors.d.size = 0;
  local_1c8.d = (Data *)0x0;
  local_1c8.ptr = (BasicSelector *)0x0;
  decl.d.d.ptr = (QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>)
                 &DAT_aaaaaaaaaaaaaaaa;
  QCss::Declaration::Declaration(&decl);
  local_60 = &DAT_aaaaaaaaaaaaaaaa;
  local_58.shared = (PrivateShared *)0x0;
  local_58._8_8_ = 0;
  local_58._16_8_ = 0;
  local_40 = 2;
  local_168.name.d.d = (Data *)0x0;
  local_168.name.d.ptr = (char16_t *)0x0;
  local_168.name.d.size = 0;
  local_168.function.d.d = (Data *)0x0;
  local_168.function.d.ptr = (char16_t *)0x0;
  local_168.function.d.size = 0;
  local_168.negated = false;
  local_168._57_7_ = 0xaaaaaaaaaaaaaa;
  local_1a8.name.d.d = (Data *)0x0;
  local_1a8.name.d.ptr = (char16_t *)0x0;
  local_1a8.name.d.size = 0;
  local_1a8.value.d.d = (Data *)0x0;
  local_1a8.value.d.ptr = (char16_t *)0x0;
  local_1a8.value.d.size = 0;
  local_1a8.valueMatchCriterium = NoMatch;
  local_1a8._52_4_ = 0xaaaaaaaa;
  pQVar1 = baseStyle(this);
  lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QMacStyle");
  bVar5 = true;
  if (lVar2 == 0) {
    pQVar1 = baseStyle(this);
    lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QWindowsVistaStyle");
    if (lVar2 == 0) {
      bVar5 = false;
    }
    else {
      pQVar1 = baseStyle(this);
      lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QWindows11Style");
      bVar5 = lVar2 == 0;
    }
  }
  QString::operator=(&local_128.elementName,(QLatin1String *)0x9);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  pQVar4 = &local_b8.declarations;
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x12);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x53;
  local_60._0_4_ = Identifier;
  psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
  QVar6.m_data = psVar3;
  QVar6.m_size = (qsizetype)&local_1e8;
  QString::fromLatin1(QVar6);
  ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x9);
  local_168.type = 0x20000000;
  QString::operator=(&local_168.name,(QLatin1String *)0x8);
  QList<QCss::Pseudo>::emplaceBack<QCss::Pseudo_const&>(&local_128.pseudos,&local_168);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x27);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(&local_b8.declarations);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x6);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(&local_b8.declarations);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x6);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x8);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0xa);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x3c;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x27);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  pQVar4 = &local_b8.declarations;
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0xc);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x43;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x27);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x9);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(&local_b8.declarations);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x8);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  pQVar4 = &local_b8.declarations;
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0xb);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=(&local_128.elementName,(QLatin1String *)0xb);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0xc);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x2c;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  if (!bVar5) {
    QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x12);
    *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x53;
    local_60._0_4_ = Identifier;
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
    QVar7.m_data = psVar3;
    QVar7.m_size = (qsizetype)&local_1e8;
    QString::fromLatin1(QVar7);
    ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
    ::QVariant::operator=((QVariant *)&local_58,&local_80);
    ::QVariant::~QVariant(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
    QList<QCss::Value>::emplaceBack<QCss::Value_const&>
              ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
    QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  }
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(&local_b8.declarations);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x9);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  if (!bVar5) {
    QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x12);
    *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x53;
    local_60._0_4_ = Identifier;
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
    QVar8.m_data = psVar3;
    QVar8.m_size = (qsizetype)&local_1e8;
    QString::fromLatin1(QVar8);
    ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
    ::QVariant::operator=((QVariant *)&local_58,&local_80);
    ::QVariant::~QVariant(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
    QList<QCss::Value>::emplaceBack<QCss::Value_const&>
              ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
    local_60._0_4_ = Identifier;
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-gradient",0x14);
    QVar9.m_data = psVar3;
    QVar9.m_size = (qsizetype)&local_1e8;
    QString::fromLatin1(QVar9);
    ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
    ::QVariant::operator=((QVariant *)&local_58,&local_80);
    ::QVariant::~QVariant(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
    QList<QCss::Value>::emplaceBack<QCss::Value_const&>
              ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
    QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  }
  pQVar4 = &local_b8.declarations;
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60 = (undefined1 *)CONCAT44(local_60._4_4_,KnownIdentifier);
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  pQVar1 = baseStyle(this);
  lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QPlastiqueStyle");
  if (lVar2 == 0) {
    pQVar1 = baseStyle(this);
    lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QCleanlooksStyle");
    if (lVar2 == 0) {
      pQVar1 = baseStyle(this);
      lVar2 = (**(code **)(*(long *)pQVar1 + 8))(pQVar1,"QFusionStyle");
      if (lVar2 == 0) goto LAB_00366b75;
    }
  }
  QString::operator=(&local_128.elementName,(QLatin1String *)0x9);
  QString::operator=(&local_1a8.name,(QLatin1String *)0x8);
  QString::operator=(&local_1a8.value,(QLatin1String *)0x4);
  local_1a8.valueMatchCriterium = MatchEqual;
  QList<QCss::AttributeSelector>::emplaceBack<QCss::AttributeSelector_const&>
            (&local_128.attributeSelectors,&local_1a8);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60 = (undefined1 *)CONCAT44(local_60._4_4_,KnownIdentifier);
  ::QVariant::QVariant(&local_80,0x3c);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
LAB_00366b75:
  QString::operator=(&local_128.elementName,(QLatin1String *)0x10);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x12);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x53;
  local_60._0_4_ = Identifier;
  psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
  QVar10.m_data = psVar3;
  QVar10.m_size = (qsizetype)&local_1e8;
  QString::fromLatin1(QVar10);
  ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x5);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  if (!bVar5) {
    QString::operator=(&local_128.elementName,(QLatin1String *)0x5);
    local_168.type = 0;
    QString::operator=(&local_168.name,(QLatin1String *)0x4);
    QList<QCss::Pseudo>::emplaceBack<QCss::Pseudo_const&>(&local_128.pseudos,&local_168);
    QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
              ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
    QList<QString>::clear(&local_128.ids);
    QList<QCss::Pseudo>::clear(&local_128.pseudos);
    QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
    QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
              (&local_b8.selectors,(Selector *)&local_1c8);
    QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
    QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x12);
    *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x53;
    local_60._0_4_ = Identifier;
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
    QVar11.m_data = psVar3;
    QVar11.m_size = (qsizetype)&local_1e8;
    QString::fromLatin1(QVar11);
    ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
    ::QVariant::operator=((QVariant *)&local_58,&local_80);
    ::QVariant::~QVariant(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
    QList<QCss::Value>::emplaceBack<QCss::Value_const&>
              ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
    QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
    QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
              (&__return_storage_ptr__->styleRules,&local_b8);
    QList<QCss::Selector>::clear(&local_b8.selectors);
    QList<QCss::Declaration>::clear(&local_b8.declarations);
  }
  QString::operator=(&local_128.elementName,(QLatin1String *)0xb);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(&local_b8.declarations);
  QString::operator=(&local_128.elementName,(QLatin1String *)0x12);
  local_168.type = 0;
  QString::operator=(&local_168.name,(QLatin1String *)0x7);
  this_00 = &local_128.pseudos;
  QList<QCss::Pseudo>::emplaceBack<QCss::Pseudo_const&>(this_00,&local_168);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(this_00);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=(&local_128.elementName,(QLatin1String *)0xb);
  local_168.type = 0;
  QString::operator=(&local_168.name,(QLatin1String *)0x7);
  QList<QCss::Pseudo>::emplaceBack<QCss::Pseudo_const&>(this_00,&local_168);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(this_00);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x3c);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  if (!bVar5) {
    QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x12);
    *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x53;
    local_60._0_4_ = Identifier;
    psVar3 = (storage_type *)QByteArrayView::lengthHelperCharArray("background-color",0x11);
    QVar12.m_data = psVar3;
    QVar12.m_size = (qsizetype)&local_1e8;
    QString::fromLatin1(QVar12);
    ::QVariant::QVariant(&local_80,(QString *)&local_1e8);
    ::QVariant::operator=((QVariant *)&local_58,&local_80);
    ::QVariant::~QVariant(&local_80);
    QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_1e8);
    QList<QCss::Value>::emplaceBack<QCss::Value_const&>
              ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
    QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(&local_b8.declarations,&decl);
    QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
    QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  }
  pQVar4 = &local_b8.declarations;
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0xc);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x44);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0xa);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x13);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x54;
  local_60._0_4_ = KnownIdentifier;
  ::QVariant::QVariant(&local_80,0x45);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  QString::operator=(&local_128.elementName,(QLatin1String *)0xb);
  QList<QCss::BasicSelector>::emplaceBack<QCss::BasicSelector_const&>
            ((QList<QCss::BasicSelector> *)&local_1c8,&local_128);
  QList<QString>::clear(&local_128.ids);
  QList<QCss::Pseudo>::clear(&local_128.pseudos);
  QList<QCss::AttributeSelector>::clear(&local_128.attributeSelectors);
  QList<QCss::Selector>::emplaceBack<QCss::Selector_const&>
            (&local_b8.selectors,(Selector *)&local_1c8);
  QList<QCss::BasicSelector>::clear((QList<QCss::BasicSelector> *)&local_1c8);
  QString::operator=((QString *)((long)decl.d.d.ptr + 8),(QLatin1String *)0x6);
  *(undefined4 *)((long)decl.d.d.ptr + 0x20) = 0x1a;
  local_60 = (undefined1 *)CONCAT44(local_60._4_4_,KnownIdentifier);
  ::QVariant::QVariant(&local_80,0x18);
  ::QVariant::operator=((QVariant *)&local_58,&local_80);
  ::QVariant::~QVariant(&local_80);
  QList<QCss::Value>::emplaceBack<QCss::Value_const&>
            ((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28),(Value *)&local_60);
  QList<QCss::Declaration>::emplaceBack<QCss::Declaration_const&>(pQVar4,&decl);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::detach(&decl.d);
  QList<QCss::Value>::clear((QList<QCss::Value> *)((long)decl.d.d.ptr + 0x28));
  QList<QCss::StyleRule>::emplaceBack<QCss::StyleRule_const&>
            (&__return_storage_ptr__->styleRules,&local_b8);
  QList<QCss::Selector>::clear(&local_b8.selectors);
  QList<QCss::Declaration>::clear(pQVar4);
  __return_storage_ptr__->origin = StyleSheetOrigin_UserAgent;
  QCss::StyleSheet::buildIndexes((CaseSensitivity)__return_storage_ptr__);
  QCss::AttributeSelector::~AttributeSelector(&local_1a8);
  QCss::Pseudo::~Pseudo(&local_168);
  ::QVariant::~QVariant((QVariant *)&local_58);
  QExplicitlySharedDataPointer<QCss::Declaration::DeclarationData>::~QExplicitlySharedDataPointer
            (&decl.d);
  QArrayDataPointer<QCss::BasicSelector>::~QArrayDataPointer(&local_1c8);
  QCss::BasicSelector::~BasicSelector(&local_128);
  QCss::StyleRule::~StyleRule(&local_b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

StyleSheet QStyleSheetStyle::getDefaultStyleSheet() const
{
    StyleSheet sheet;
    StyleRule styleRule;
    BasicSelector bSelector;
    Selector selector;
    Declaration decl;
    QCss::Value value;
    Pseudo pseudo;
    AttributeSelector attr;

    // pixmap based style doesn't support any features
    bool styleIsPixmapBased = baseStyle()->inherits("QMacStyle")
            || (baseStyle()->inherits("QWindowsVistaStyle")
                && !baseStyle()->inherits("QWindows11Style"));


    /*QLineEdit {
        -qt-background-role: base;
        border: native;
        -qt-style-features: background-color;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLineEdit:no-frame {
        border: none;
    }*/
    {
        SET_ELEMENT_NAME("QLineEdit"_L1);
        ADD_PSEUDO("no-frame"_L1, PseudoClass_Frameless);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QFrame {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QFrame"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QLabel, QToolBox {
        background: none;
        border-image: none;
    }*/
    {
        SET_ELEMENT_NAME("QLabel"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("background"_L1, Background);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        SET_PROPERTY("border-image"_L1, BorderImage);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_None);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QGroupBox {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QGroupBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }


    /*QToolTip {
        -qt-background-role: window;
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QToolTip"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QPushButton, QToolButton {
        border-style: native;
        -qt-style-features: background-color;  //only for not pixmap based styles
    }*/
    {
        SET_ELEMENT_NAME("QPushButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QToolButton"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border-style"_L1, BorderStyles);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }


        ADD_STYLE_RULE;
    }


    /*QComboBox {
        border: native;
        -qt-style-features: background-color background-gradient;   //only for not pixmap based styles
        -qt-background-role: base;
    }*/

    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-gradient"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QComboBox[style="QPlastiqueStyle"][readOnly="true"],
    QComboBox[style="QFusionStyle"][readOnly="true"],
    QComboBox[style="QCleanlooksStyle"][readOnly="true"]
    {
        -qt-background-role: button;
    }*/
    if (baseStyle()->inherits("QPlastiqueStyle")  || baseStyle()->inherits("QCleanlooksStyle") || baseStyle()->inherits("QFusionStyle"))
    {
        SET_ELEMENT_NAME("QComboBox"_L1);
        ADD_ATTRIBUTE_SELECTOR("readOnly"_L1, "true"_L1, AttributeSelector::MatchEqual);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QAbstractSpinBox {
        border: native;
        -qt-style-features: background-color;
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QAbstractSpinBox"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QMenu {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }
    /*QMenu::item {
        -qt-style-features: background-color;
    }*/
    if (!styleIsPixmapBased) {
        SET_ELEMENT_NAME("QMenu"_L1);
        ADD_PSEUDO("item"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
        ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QHeaderView {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QTableCornerButton::section, QHeaderView::section {
        -qt-background-role: button;
        -qt-style-features: background-color; //if style is not pixmap based
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QTableCornerButton"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_ELEMENT_NAME("QHeaderView"_L1);
        ADD_PSEUDO("section"_L1, PseudoClass_Unknown);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Button);
        ADD_DECLARATION;

        if (!styleIsPixmapBased) {
            SET_PROPERTY("-qt-style-features"_L1, QtStyleFeatures);
            ADD_VALUE(QCss::Value::Identifier, QString::fromLatin1("background-color"));
            ADD_DECLARATION;
        }

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QProgressBar {
        -qt-background-role: base;
    }*/
    {
        SET_ELEMENT_NAME("QProgressBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Base);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QScrollBar {
        -qt-background-role: window;
    }*/
    {
        SET_ELEMENT_NAME("QScrollBar"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("-qt-background-role"_L1, QtBackgroundRole);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Window);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    /*QDockWidget {
        border: native;
    }*/
    {
        SET_ELEMENT_NAME("QDockWidget"_L1);
        ADD_BASIC_SELECTOR;
        ADD_SELECTOR;

        SET_PROPERTY("border"_L1, Border);
        ADD_VALUE(QCss::Value::KnownIdentifier, Value_Native);
        ADD_DECLARATION;

        ADD_STYLE_RULE;
    }

    sheet.origin = StyleSheetOrigin_UserAgent;
    sheet.buildIndexes();
    return sheet;
}